

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

bool __thiscall
ON_GeometryFingerprint::Write(ON_GeometryFingerprint *this,ON_BinaryArchive *binary_archive)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ON_3dPoint *pOVar4;
  
  bVar1 = ON_BinaryArchive::WriteInt(binary_archive,this->m_topologyCRC);
  if ((bVar1) &&
     (bVar1 = ON_BinaryArchive::WritePoint(binary_archive,(this->m_pointWAH).m_sum), bVar1)) {
    pOVar4 = (this->m_pointWAH).m_sum;
    uVar3 = 0xffffffffffffffff;
    do {
      pOVar4 = pOVar4 + 1;
      if (uVar3 == 3) goto LAB_004d9c35;
      bVar1 = ON_BinaryArchive::WritePoint(binary_archive,pOVar4);
      uVar3 = uVar3 + 1;
    } while (bVar1);
    if (3 < uVar3) {
LAB_004d9c35:
      bVar1 = ON_BinaryArchive::WritePoint(binary_archive,(this->m_edgeWAH).m_sum);
      if (bVar1) {
        pOVar4 = (this->m_edgeWAH).m_sum;
        uVar3 = 0;
        do {
          uVar2 = uVar3;
          pOVar4 = pOVar4 + 1;
          if (uVar2 == 4) break;
          bVar1 = ON_BinaryArchive::WritePoint(binary_archive,pOVar4);
          uVar3 = uVar2 + 1;
        } while (bVar1);
        return 3 < uVar2;
      }
    }
  }
  return false;
}

Assistant:

bool ON_GeometryFingerprint::Write(ON_BinaryArchive& binary_archive) const
{
  if (!binary_archive.WriteInt(m_topologyCRC))
    return false;
  if (!m_pointWAH.Write(binary_archive))
    return false;
  if (!m_edgeWAH.Write(binary_archive))
    return false;
  return true;
}